

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

vector<RPCArg,_std::allocator<RPCArg>_> *
wallet::FundTxDoc(vector<RPCArg,_std::allocator<RPCArg>_> *__return_storage_ptr__,bool solving_data)

{
  string name;
  string default_info;
  string name_00;
  string name_01;
  string str;
  string name_02;
  string name_03;
  string str_00;
  string name_04;
  string name_05;
  string str_01;
  string name_06;
  string name_07;
  string name_08;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  vector<RPCArg,_std::allocator<RPCArg>_> inner;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_00;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_01;
  vector<RPCArg,_std::allocator<RPCArg>_> inner_02;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  RPCArgOptions opts_01;
  RPCArgOptions opts_02;
  RPCArgOptions opts_03;
  RPCArgOptions opts_04;
  RPCArgOptions opts_05;
  RPCArgOptions opts_06;
  RPCArgOptions opts_07;
  RPCArgOptions opts_08;
  long lVar1;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCArg> __l_01;
  initializer_list<RPCArg> __l_02;
  initializer_list<RPCArg> __l_03;
  _Alloc_hider in_stack_ffffffffffffed68;
  _Alloc_hider _Var2;
  undefined1 in_stack_ffffffffffffed70 [24];
  _Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
  in_stack_ffffffffffffed88;
  undefined1 in_stack_ffffffffffffede8 [16];
  bool in_stack_ffffffffffffedf8;
  undefined7 in_stack_ffffffffffffedf9;
  _Alloc_hider in_stack_ffffffffffffee00;
  size_type in_stack_ffffffffffffee08;
  undefined1 in_stack_ffffffffffffee10;
  undefined1 in_stack_ffffffffffffee11 [15];
  pointer in_stack_ffffffffffffee20;
  undefined2 in_stack_ffffffffffffee28;
  undefined6 in_stack_ffffffffffffee2a;
  undefined2 in_stack_ffffffffffffee30;
  undefined8 in_stack_ffffffffffffee32;
  undefined6 in_stack_ffffffffffffee3a;
  bool in_stack_ffffffffffffee40;
  bool bVar3;
  undefined7 in_stack_ffffffffffffee41;
  _Alloc_hider in_stack_ffffffffffffee48;
  size_type in_stack_ffffffffffffee50;
  size_type sVar4;
  undefined1 in_stack_ffffffffffffee58;
  undefined1 uVar5;
  undefined1 in_stack_ffffffffffffee59 [15];
  RPCArgOptions local_1178;
  string local_1130 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_1110;
  undefined1 local_10b8;
  string local_10b0 [32];
  RPCArg local_1090;
  string local_f88 [32];
  undefined1 *local_f68;
  undefined8 local_f60;
  undefined1 local_f58 [16];
  UniValue local_f48;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_ef0;
  string local_e90 [32];
  RPCArgOptions local_e70;
  RPCArgOptions local_e28;
  string local_de0 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_dc0;
  undefined1 local_d68;
  string local_d60 [32];
  RPCArg local_d40;
  string local_c38 [32];
  undefined1 *local_c18;
  undefined8 local_c10;
  undefined1 local_c08 [16];
  UniValue local_bf8;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_ba0;
  string local_b40 [32];
  RPCArgOptions local_b20;
  RPCArgOptions local_ad8;
  string local_a90 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_a70;
  undefined1 local_a18;
  string local_a10 [32];
  RPCArg local_9f0;
  string local_8e8 [32];
  undefined1 *local_8c8;
  undefined8 local_8c0;
  undefined1 local_8b8 [16];
  UniValue local_8a8;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_850;
  string local_7f0 [32];
  string local_7d0 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_7b0;
  undefined1 local_758;
  string local_750 [32];
  RPCArg local_730;
  RPCArgOptions local_628;
  string local_5e0 [32];
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_5c0;
  string local_560 [32];
  RPCArgOptions local_540;
  string local_4f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_4b8;
  string local_458 [32];
  RPCArgOptions local_438;
  string local_3f0 [32];
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_3d0;
  string local_370 [32];
  RPCArg local_350 [3];
  long local_38;
  
  local_1090.m_fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_370,"conf_target",(allocator<char> *)&local_8a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9f0,"wallet -txconfirmtarget",(allocator<char> *)&local_bf8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_3d0,
             &local_9f0.m_names);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3f0,"Confirmation target in blocks",(allocator<char> *)&local_f48);
  local_438.oneline_description._M_dataplus._M_p = (pointer)&local_438.oneline_description.field_2;
  local_438.skip_type_check = false;
  local_438.oneline_description._M_string_length = 0;
  local_438.oneline_description.field_2._M_local_buf[0] = '\0';
  local_438.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_438.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_438.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_438.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_438._57_8_ = 0;
  local_438.also_positional = true;
  name._M_string_length = in_stack_ffffffffffffed70._0_8_;
  name.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  )in_stack_ffffffffffffed70._8_16_;
  name._M_dataplus._M_p = in_stack_ffffffffffffed68._M_p;
  description.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description.field_2._8_8_ = in_stack_ffffffffffffee00._M_p;
  opts.oneline_description._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffee10;
  opts._0_8_ = in_stack_ffffffffffffee08;
  opts.oneline_description._1_15_ = in_stack_ffffffffffffee11;
  opts.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffee20;
  opts.oneline_description.field_2._8_2_ = in_stack_ffffffffffffee28;
  opts.oneline_description.field_2._10_6_ = in_stack_ffffffffffffee2a;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_2_ = in_stack_ffffffffffffee30;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = in_stack_ffffffffffffee32;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = in_stack_ffffffffffffee3a;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_ffffffffffffee40;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_ffffffffffffee41;
  opts._64_8_ = in_stack_ffffffffffffee48._M_p;
  RPCArg::RPCArg(local_350,name,(Type)local_370,(Fallback)in_stack_ffffffffffffed88,description,opts
                );
  std::__cxx11::string::string<std::allocator<char>>
            (local_458,"estimate_mode",(allocator<char> *)&stack0xffffffffffffedf7);
  UniValue::UniValue<const_char_(&)[6],_char[6],_true>((UniValue *)&local_730,(char (*) [6])"unset")
  ;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_4b8,
             (UniValue *)&local_730);
  std::__cxx11::string::string<std::allocator<char>>
            (local_4f8,
             "economical mode is used if the transaction is replaceable;\notherwise, conservative mode is used"
             ,(allocator<char> *)&stack0xffffffffffffedf6);
  default_info._M_string_length = in_stack_ffffffffffffed70._0_8_;
  default_info.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed70._8_16_;
  default_info._M_dataplus._M_p = in_stack_ffffffffffffed68._M_p;
  common::FeeModesDetail(&local_d40.m_names,default_info);
  std::operator+(&local_4d8,"The fee estimate mode, must be one of (case insensitive):\n",
                 &local_d40.m_names);
  local_540.oneline_description._M_dataplus._M_p = (pointer)&local_540.oneline_description.field_2;
  local_540.skip_type_check = false;
  local_540.oneline_description._M_string_length = 0;
  local_540.oneline_description.field_2._M_local_buf[0] = '\0';
  local_540.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_540.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_540.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_540.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_540._57_8_ = 0;
  local_540.also_positional = true;
  name_00._M_string_length = in_stack_ffffffffffffed70._0_8_;
  name_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed70._8_16_;
  name_00._M_dataplus._M_p = in_stack_ffffffffffffed68._M_p;
  description_00.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_00._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_00.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_00.field_2._8_8_ = in_stack_ffffffffffffee00._M_p;
  opts_00.oneline_description._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffee10;
  opts_00._0_8_ = in_stack_ffffffffffffee08;
  opts_00.oneline_description._1_15_ = in_stack_ffffffffffffee11;
  opts_00.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffee20;
  opts_00.oneline_description.field_2._8_2_ = in_stack_ffffffffffffee28;
  opts_00.oneline_description.field_2._10_6_ = in_stack_ffffffffffffee2a;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_2_ = in_stack_ffffffffffffee30;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = in_stack_ffffffffffffee32;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = in_stack_ffffffffffffee3a;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_ffffffffffffee40;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_ffffffffffffee41;
  opts_00._64_8_ = in_stack_ffffffffffffee48._M_p;
  RPCArg::RPCArg(local_350 + 1,name_00,(Type)local_458,(Fallback)in_stack_ffffffffffffed88,
                 description_00,opts_00);
  std::__cxx11::string::string<std::allocator<char>>
            (local_560,"replaceable",(allocator<char> *)&stack0xffffffffffffedf5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1090,"wallet default",(allocator<char> *)&stack0xffffffffffffedf4);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_5c0,
             &local_1090.m_names);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5e0,
             "Marks this transaction as BIP125-replaceable.\nAllows this transaction to be replaced by a transaction with higher fees"
             ,(allocator<char> *)&stack0xffffffffffffedf3);
  local_628.oneline_description._M_dataplus._M_p = (pointer)&local_628.oneline_description.field_2;
  local_628.skip_type_check = false;
  local_628.oneline_description._M_string_length = 0;
  local_628.oneline_description.field_2._M_local_buf[0] = '\0';
  local_628.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_628.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_628.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_628.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_628._58_8_ = 0;
  name_01._M_string_length = in_stack_ffffffffffffed70._0_8_;
  name_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed70._8_16_;
  name_01._M_dataplus._M_p = in_stack_ffffffffffffed68._M_p;
  description_01.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_01._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_01.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_01.field_2._8_8_ = in_stack_ffffffffffffee00._M_p;
  opts_01.oneline_description._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffee10;
  opts_01._0_8_ = in_stack_ffffffffffffee08;
  opts_01.oneline_description._1_15_ = in_stack_ffffffffffffee11;
  opts_01.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffee20;
  opts_01.oneline_description.field_2._8_2_ = in_stack_ffffffffffffee28;
  opts_01.oneline_description.field_2._10_6_ = in_stack_ffffffffffffee2a;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_2_ = in_stack_ffffffffffffee30;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = in_stack_ffffffffffffee32;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = in_stack_ffffffffffffee3a;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_ffffffffffffee40;
  opts_01.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_ffffffffffffee41;
  opts_01._64_8_ = in_stack_ffffffffffffee48._M_p;
  RPCArg::RPCArg(local_350 + 2,name_01,(Type)local_560,(Fallback)in_stack_ffffffffffffed88,
                 description_01,opts_01);
  __l._M_len = 3;
  __l._M_array = local_350;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            (__return_storage_ptr__,__l,(allocator_type *)&stack0xffffffffffffedf2);
  lVar1 = 0x210;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_350[0].m_names._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x108;
  } while (lVar1 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_628);
  std::__cxx11::string::~string(local_5e0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_5c0);
  std::__cxx11::string::~string((string *)&local_1090);
  std::__cxx11::string::~string(local_560);
  RPCArgOptions::~RPCArgOptions(&local_540);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_d40);
  std::__cxx11::string::~string(local_4f8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_4b8);
  UniValue::~UniValue((UniValue *)&local_730);
  std::__cxx11::string::~string(local_458);
  RPCArgOptions::~RPCArgOptions(&local_438);
  std::__cxx11::string::~string(local_3f0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_3d0);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string(local_370);
  std::__cxx11::string::string<std::allocator<char>>
            (local_750,"solving_data",(allocator<char> *)&stack0xffffffffffffedf7);
  local_7b0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_758 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_7d0,
             "Keys and scripts needed for producing a final transaction with a dummy signature.\nUsed for fee estimation during coin selection."
             ,(allocator<char> *)&stack0xffffffffffffedf6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7f0,"pubkeys",(allocator<char> *)&stack0xffffffffffffedf5);
  local_8c8 = local_8b8;
  local_8c0 = 0;
  local_8b8[0] = 0;
  str._M_string_length = in_stack_ffffffffffffed70._0_8_;
  str.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )in_stack_ffffffffffffed70._8_16_;
  str._M_dataplus._M_p = in_stack_ffffffffffffed68._M_p;
  UniValue::UniValue(&local_8a8,VARR,str);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_850,&local_8a8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8e8,"Public keys involved in this transaction.",
             (allocator<char> *)&stack0xffffffffffffedf4);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a10,"pubkey",(allocator<char> *)&stack0xffffffffffffedf3);
  local_a70._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_a18 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_a90,"A public key",(allocator<char> *)&stack0xffffffffffffedf2);
  local_ad8.oneline_description._M_dataplus._M_p = (pointer)&local_ad8.oneline_description.field_2;
  local_ad8.skip_type_check = false;
  local_ad8.oneline_description._M_string_length = 0;
  local_ad8.oneline_description.field_2._M_local_buf[0] = '\0';
  local_ad8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_ad8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_ad8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_ad8.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_ad8._58_8_ = 0;
  name_02._M_string_length = in_stack_ffffffffffffed70._0_8_;
  name_02.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed70._8_16_;
  name_02._M_dataplus._M_p = in_stack_ffffffffffffed68._M_p;
  description_02.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_02._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_02.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_02.field_2._8_8_ = in_stack_ffffffffffffee00._M_p;
  opts_02.oneline_description._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffee10;
  opts_02._0_8_ = in_stack_ffffffffffffee08;
  opts_02.oneline_description._1_15_ = in_stack_ffffffffffffee11;
  opts_02.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffee20;
  opts_02.oneline_description.field_2._8_2_ = in_stack_ffffffffffffee28;
  opts_02.oneline_description.field_2._10_6_ = in_stack_ffffffffffffee2a;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_2_ = in_stack_ffffffffffffee30;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = in_stack_ffffffffffffee32;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = in_stack_ffffffffffffee3a;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_ffffffffffffee40;
  opts_02.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_ffffffffffffee41;
  opts_02._64_8_ = in_stack_ffffffffffffee48._M_p;
  RPCArg::RPCArg(&local_9f0,name_02,(Type)local_a10,(Fallback)in_stack_ffffffffffffed88,
                 description_02,opts_02);
  __l_00._M_len = 1;
  __l_00._M_array = &local_9f0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffedc0,__l_00,
             (allocator_type *)&stack0xffffffffffffedbf);
  local_b20.oneline_description._M_dataplus._M_p = (pointer)&local_b20.oneline_description.field_2;
  local_b20.skip_type_check = false;
  local_b20.oneline_description._M_string_length = 0;
  local_b20.oneline_description.field_2._M_local_buf[0] = '\0';
  local_b20.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b20.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_b20.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_b20.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_b20._58_8_ = 0;
  _Var2._M_p = &local_b20.skip_type_check;
  name_03._M_string_length = in_stack_ffffffffffffed70._0_8_;
  name_03.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed70._8_16_;
  name_03._M_dataplus._M_p = _Var2._M_p;
  description_03.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_03._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_03.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_03.field_2._8_8_ = in_stack_ffffffffffffee00._M_p;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = in_stack_ffffffffffffee10;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffee08;
  inner.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._9_15_ =
       in_stack_ffffffffffffee11;
  opts_05.oneline_description._M_dataplus._M_p._0_2_ = in_stack_ffffffffffffee28;
  opts_05._0_8_ = in_stack_ffffffffffffee20;
  opts_05.oneline_description._M_dataplus._M_p._2_6_ = in_stack_ffffffffffffee2a;
  opts_05.oneline_description._M_string_length._0_2_ = in_stack_ffffffffffffee30;
  opts_05.oneline_description._10_8_ = in_stack_ffffffffffffee32;
  opts_05.oneline_description.field_2._M_allocated_capacity._2_6_ = in_stack_ffffffffffffee3a;
  opts_05.oneline_description.field_2._M_local_buf[8] = in_stack_ffffffffffffee40;
  opts_05.oneline_description.field_2._9_7_ = in_stack_ffffffffffffee41;
  opts_05.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffee48._M_p;
  opts_05.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffee50;
  opts_05.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_ffffffffffffee58;
  opts_05._57_15_ = in_stack_ffffffffffffee59;
  RPCArg::RPCArg(local_350,name_03,(Type)local_7f0,(Fallback)in_stack_ffffffffffffed88,
                 description_03,inner,opts_05);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b40,"scripts",(allocator<char> *)&stack0xffffffffffffedbe);
  local_c18 = local_c08;
  local_c10 = 0;
  local_c08[0] = 0;
  str_00._M_string_length = in_stack_ffffffffffffed70._0_8_;
  str_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed70._8_16_;
  str_00._M_dataplus._M_p = _Var2._M_p;
  UniValue::UniValue(&local_bf8,VARR,str_00);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_ba0,&local_bf8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c38,"Scripts involved in this transaction.",
             (allocator<char> *)&stack0xffffffffffffedbd);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d60,"script",(allocator<char> *)&stack0xffffffffffffed9f);
  local_dc0._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_d68 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_de0,"A script",(allocator<char> *)&stack0xffffffffffffed9e);
  local_e28.oneline_description._M_dataplus._M_p = (pointer)&local_e28.oneline_description.field_2;
  local_e28.skip_type_check = false;
  local_e28.oneline_description._M_string_length = 0;
  local_e28.oneline_description.field_2._M_local_buf[0] = '\0';
  local_e28.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e28.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_e28.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_e28.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_e28._58_8_ = 0;
  name_04._M_string_length = in_stack_ffffffffffffed70._0_8_;
  name_04.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed70._8_16_;
  name_04._M_dataplus._M_p = _Var2._M_p;
  description_04.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_04._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_04.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_04.field_2._8_8_ = in_stack_ffffffffffffee00._M_p;
  opts_03.oneline_description._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffee10;
  opts_03._0_8_ = in_stack_ffffffffffffee08;
  opts_03.oneline_description._1_15_ = in_stack_ffffffffffffee11;
  opts_03.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffee20;
  opts_03.oneline_description.field_2._8_2_ = in_stack_ffffffffffffee28;
  opts_03.oneline_description.field_2._10_6_ = in_stack_ffffffffffffee2a;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_2_ = in_stack_ffffffffffffee30;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = in_stack_ffffffffffffee32;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = in_stack_ffffffffffffee3a;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_ffffffffffffee40;
  opts_03.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_ffffffffffffee41;
  opts_03._64_8_ = in_stack_ffffffffffffee48._M_p;
  RPCArg::RPCArg(&local_d40,name_04,(Type)local_d60,(Fallback)in_stack_ffffffffffffed88,
                 description_04,opts_03);
  __l_01._M_len = 1;
  __l_01._M_array = &local_d40;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffeda0,__l_01,
             (allocator_type *)&stack0xffffffffffffed9d);
  local_e70.oneline_description._M_dataplus._M_p = (pointer)&local_e70.oneline_description.field_2;
  local_e70.skip_type_check = false;
  local_e70.oneline_description._M_string_length = 0;
  local_e70.oneline_description.field_2._M_local_buf[0] = '\0';
  local_e70.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e70.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_e70.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_e70.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_e70._58_8_ = 0;
  _Var2._M_p = &local_e70.skip_type_check;
  name_05._M_string_length = in_stack_ffffffffffffed70._0_8_;
  name_05.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed70._8_16_;
  name_05._M_dataplus._M_p = _Var2._M_p;
  description_05.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_05._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_05.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_05.field_2._8_8_ = in_stack_ffffffffffffee00._M_p;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = in_stack_ffffffffffffee10;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffee08;
  inner_00.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _9_15_ = in_stack_ffffffffffffee11;
  opts_06.oneline_description._M_dataplus._M_p._0_2_ = in_stack_ffffffffffffee28;
  opts_06._0_8_ = in_stack_ffffffffffffee20;
  opts_06.oneline_description._M_dataplus._M_p._2_6_ = in_stack_ffffffffffffee2a;
  opts_06.oneline_description._M_string_length._0_2_ = in_stack_ffffffffffffee30;
  opts_06.oneline_description._10_8_ = in_stack_ffffffffffffee32;
  opts_06.oneline_description.field_2._M_allocated_capacity._2_6_ = in_stack_ffffffffffffee3a;
  opts_06.oneline_description.field_2._M_local_buf[8] = in_stack_ffffffffffffee40;
  opts_06.oneline_description.field_2._9_7_ = in_stack_ffffffffffffee41;
  opts_06.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffee48._M_p;
  opts_06.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffee50;
  opts_06.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_ffffffffffffee58;
  opts_06._57_15_ = in_stack_ffffffffffffee59;
  RPCArg::RPCArg(local_350 + 1,name_05,(Type)local_b40,(Fallback)in_stack_ffffffffffffed88,
                 description_05,inner_00,opts_06);
  std::__cxx11::string::string<std::allocator<char>>
            (local_e90,"descriptors",(allocator<char> *)&stack0xffffffffffffed9c);
  local_f68 = local_f58;
  local_f60 = 0;
  local_f58[0] = 0;
  str_01._M_string_length = in_stack_ffffffffffffed70._0_8_;
  str_01.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed70._8_16_;
  str_01._M_dataplus._M_p = _Var2._M_p;
  UniValue::UniValue(&local_f48,VARR,str_01);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_ef0,&local_f48);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f88,"Descriptors that provide solving data for this transaction.",
             (allocator<char> *)&stack0xffffffffffffed9b);
  std::__cxx11::string::string<std::allocator<char>>
            (local_10b0,"descriptor",(allocator<char> *)&stack0xffffffffffffed7f);
  local_1110._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_10b8 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_1130,"A descriptor",(allocator<char> *)&stack0xffffffffffffed7e);
  local_1178.oneline_description._M_dataplus._M_p = (pointer)&local_1178.oneline_description.field_2
  ;
  local_1178.skip_type_check = false;
  local_1178.oneline_description._M_string_length = 0;
  local_1178.oneline_description.field_2._M_local_buf[0] = '\0';
  local_1178.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1178.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_1178.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_1178.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_1178._58_8_ = 0;
  name_06._M_string_length = in_stack_ffffffffffffed70._0_8_;
  name_06.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed70._8_16_;
  name_06._M_dataplus._M_p = _Var2._M_p;
  description_06.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_06._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_06.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_06.field_2._8_8_ = in_stack_ffffffffffffee00._M_p;
  opts_04.oneline_description._M_dataplus._M_p._0_1_ = in_stack_ffffffffffffee10;
  opts_04._0_8_ = in_stack_ffffffffffffee08;
  opts_04.oneline_description._1_15_ = in_stack_ffffffffffffee11;
  opts_04.oneline_description.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffee20;
  opts_04.oneline_description.field_2._8_2_ = in_stack_ffffffffffffee28;
  opts_04.oneline_description.field_2._10_6_ = in_stack_ffffffffffffee2a;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_2_ = in_stack_ffffffffffffee30;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._2_8_ = in_stack_ffffffffffffee32;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = in_stack_ffffffffffffee3a;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = in_stack_ffffffffffffee40;
  opts_04.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = in_stack_ffffffffffffee41;
  opts_04._64_8_ = in_stack_ffffffffffffee48._M_p;
  RPCArg::RPCArg(&local_1090,name_06,(Type)local_10b0,(Fallback)in_stack_ffffffffffffed88,
                 description_06,opts_04);
  __l_02._M_len = 1;
  __l_02._M_array = &local_1090;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffed80,__l_02,
             (allocator_type *)&stack0xffffffffffffed7d);
  _Var2._M_p = &stack0xffffffffffffee58;
  bVar3 = false;
  sVar4 = 0;
  uVar5 = '\0';
  name_07._M_string_length = in_stack_ffffffffffffed70._0_8_;
  name_07.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed70._8_16_;
  name_07._M_dataplus._M_p = &stack0xffffffffffffee40;
  description_07.field_2._M_local_buf[0] = in_stack_ffffffffffffedf8;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_07._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_07.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_07.field_2._8_8_ = in_stack_ffffffffffffee00._M_p;
  inner_01.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_1_ = in_stack_ffffffffffffee10;
  inner_01.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)in_stack_ffffffffffffee08;
  inner_01.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _9_15_ = in_stack_ffffffffffffee11;
  opts_07._57_15_ = in_stack_ffffffffffffee59;
  opts_07._0_57_ =
       ZEXT4857(CONCAT840(_Var2._M_p,
                          CONCAT733(in_stack_ffffffffffffee41,
                                    CONCAT132(0,CONCAT626(in_stack_ffffffffffffee3a,
                                                          CONCAT818(in_stack_ffffffffffffee32,
                                                                    CONCAT216(
                                                  in_stack_ffffffffffffee30,
                                                  CONCAT610(in_stack_ffffffffffffee2a,
                                                            CONCAT28(in_stack_ffffffffffffee28,
                                                                     in_stack_ffffffffffffee20))))))
                                   )));
  RPCArg::RPCArg(local_350 + 2,name_07,(Type)local_e90,(Fallback)in_stack_ffffffffffffed88,
                 description_07,inner_01,opts_07);
  __l_03._M_len = 3;
  __l_03._M_array = local_350;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffedd8,__l_03,
             (allocator_type *)&stack0xffffffffffffed7c);
  name_08._M_string_length = in_stack_ffffffffffffed70._0_8_;
  name_08.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffed70._8_16_;
  name_08._M_dataplus._M_p = &stack0xffffffffffffedf8;
  description_08.field_2._M_local_buf[0] = 0;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffede8._0_8_;
  description_08._M_string_length = in_stack_ffffffffffffede8._8_8_;
  description_08.field_2._M_allocated_capacity._1_7_ = in_stack_ffffffffffffedf9;
  description_08.field_2._8_8_ = &stack0xffffffffffffee10;
  inner_02.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _9_15_ = in_stack_ffffffffffffee11;
  inner_02.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._0_9_
       = (unkuint9)0;
  opts_08.oneline_description.field_2._M_allocated_capacity._2_6_ = in_stack_ffffffffffffee3a;
  opts_08._0_26_ = ZEXT826(0) << 0x40;
  opts_08.oneline_description.field_2._M_local_buf[8] = bVar3;
  opts_08.oneline_description.field_2._9_7_ = in_stack_ffffffffffffee41;
  opts_08.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)_Var2._M_p;
  opts_08.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)sVar4;
  opts_08.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = uVar5;
  opts_08._57_15_ = in_stack_ffffffffffffee59;
  RPCArg::RPCArg(&local_730,name_08,(Type)local_750,(Fallback)in_stack_ffffffffffffed88,
                 description_08,inner_02,opts_08);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::emplace_back<RPCArg>
            (__return_storage_ptr__,&local_730);
  RPCArg::~RPCArg(&local_730);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)&stack0xffffffffffffedf8);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffedd8);
  lVar1 = 0x210;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_350[0].m_names._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x108;
  } while (lVar1 != -0x108);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)&stack0xffffffffffffee40);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffed80);
  RPCArg::~RPCArg(&local_1090);
  RPCArgOptions::~RPCArgOptions(&local_1178);
  std::__cxx11::string::~string(local_1130);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_1110._M_first);
  std::__cxx11::string::~string(local_10b0);
  std::__cxx11::string::~string(local_f88);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_ef0);
  UniValue::~UniValue(&local_f48);
  std::__cxx11::string::~string((string *)&local_f68);
  std::__cxx11::string::~string(local_e90);
  RPCArgOptions::~RPCArgOptions(&local_e70);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffeda0);
  RPCArg::~RPCArg(&local_d40);
  RPCArgOptions::~RPCArgOptions(&local_e28);
  std::__cxx11::string::~string(local_de0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_dc0._M_first);
  std::__cxx11::string::~string(local_d60);
  std::__cxx11::string::~string(local_c38);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_ba0);
  UniValue::~UniValue(&local_bf8);
  std::__cxx11::string::~string((string *)&local_c18);
  std::__cxx11::string::~string(local_b40);
  RPCArgOptions::~RPCArgOptions(&local_b20);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xffffffffffffedc0);
  RPCArg::~RPCArg(&local_9f0);
  RPCArgOptions::~RPCArgOptions(&local_ad8);
  std::__cxx11::string::~string(local_a90);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_a70._M_first);
  std::__cxx11::string::~string(local_a10);
  std::__cxx11::string::~string(local_8e8);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_850);
  UniValue::~UniValue(&local_8a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::__cxx11::string::~string(local_7f0);
  std::__cxx11::string::~string(local_7d0);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_7b0._M_first);
  std::__cxx11::string::~string(local_750);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static std::vector<RPCArg> FundTxDoc(bool solving_data = true)
{
    std::vector<RPCArg> args = {
        {"conf_target", RPCArg::Type::NUM, RPCArg::DefaultHint{"wallet -txconfirmtarget"}, "Confirmation target in blocks", RPCArgOptions{.also_positional = true}},
        {"estimate_mode", RPCArg::Type::STR, RPCArg::Default{"unset"}, "The fee estimate mode, must be one of (case insensitive):\n"
          + FeeModesDetail(std::string("economical mode is used if the transaction is replaceable;\notherwise, conservative mode is used")), RPCArgOptions{.also_positional = true}},
        {
            "replaceable", RPCArg::Type::BOOL, RPCArg::DefaultHint{"wallet default"}, "Marks this transaction as BIP125-replaceable.\n"
            "Allows this transaction to be replaced by a transaction with higher fees"
        },
    };
    if (solving_data) {
        args.push_back({"solving_data", RPCArg::Type::OBJ, RPCArg::Optional::OMITTED, "Keys and scripts needed for producing a final transaction with a dummy signature.\n"
        "Used for fee estimation during coin selection.",
            {
                {
                    "pubkeys", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "Public keys involved in this transaction.",
                    {
                        {"pubkey", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "A public key"},
                    }
                },
                {
                    "scripts", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "Scripts involved in this transaction.",
                    {
                        {"script", RPCArg::Type::STR_HEX, RPCArg::Optional::OMITTED, "A script"},
                    }
                },
                {
                    "descriptors", RPCArg::Type::ARR, RPCArg::Default{UniValue::VARR}, "Descriptors that provide solving data for this transaction.",
                    {
                        {"descriptor", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "A descriptor"},
                    }
                },
            }
        });
    }
    return args;
}